

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::Transaction::GetTxInIndex(Transaction *this,Txid *txid,uint32_t vout)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this_00;
  pointer pTVar3;
  ulong unaff_R12;
  long lVar4;
  bool bVar5;
  undefined1 local_58 [16];
  _func_int *local_48 [2];
  Txid *local_38;
  
  pTVar3 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bVar5 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl
          .super__Vector_impl_data._M_finish != pTVar3;
  local_38 = txid;
  if (bVar5) {
    lVar4 = 0;
    unaff_R12 = 0;
    do {
      AbstractTxIn::GetTxid
                ((Txid *)local_58,
                 (AbstractTxIn *)((long)&(pTVar3->super_AbstractTxIn)._vptr_AbstractTxIn + lVar4));
      bVar1 = Txid::Equals((Txid *)local_58,local_38);
      if (bVar1) {
        uVar2 = AbstractTxIn::GetVout
                          ((AbstractTxIn *)
                           ((long)&(((this->vin_).
                                     super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxIn)
                                   ._vptr_AbstractTxIn + lVar4));
        local_58._0_8_ = &PTR__Txid_0025aa88;
        if ((void *)CONCAT44(local_58._12_4_,local_58._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_58._12_4_,local_58._8_4_));
        }
        if (uVar2 == vout) break;
      }
      else {
        local_58._0_8_ = &PTR__Txid_0025aa88;
        if ((void *)CONCAT44(local_58._12_4_,local_58._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_58._12_4_,local_58._8_4_));
        }
      }
      unaff_R12 = unaff_R12 + 1;
      pTVar3 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x90;
      bVar5 = unaff_R12 <
              (ulong)(((long)(this->vin_).
                             super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4) *
                     -0x71c71c71c71c71c7);
    } while (bVar5);
  }
  if (!bVar5) {
    local_58._0_8_ = "cfdcore_transaction.cpp";
    local_58._8_4_ = 0x201;
    local_48[0] = (_func_int *)0x21cc70;
    logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"Txid is not found.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = local_48;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Txid is not found.","");
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_58);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return (uint32_t)unaff_R12;
}

Assistant:

uint32_t Transaction::GetTxInIndex(const Txid &txid, uint32_t vout) const {
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == vout) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}